

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int internal_write_event
              (CMConnection conn,CMFormat format,void *remote_path_id,int path_len,event_item *event
              ,attr_list attrs,size_t *event_len_p)

{
  CManager cm;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 uVar4;
  size_t *psVar5;
  FFSEncodeVector full_vec;
  FILE *pFVar6;
  FFSEncodeVec *data_vec;
  char *pcVar7;
  FFSEncodeVector pFVar8;
  ulong uVar9;
  long vec_count;
  attr_list p_Var10;
  size_t sVar11;
  size_t sVar12;
  size_t sStackY_6f0;
  int attr_len;
  attr_list local_6d8;
  FFSEncodeVec *local_6d0;
  int header [4];
  void *local_6b0;
  timespec ts_3;
  FFSEncodeVec local_698;
  undefined8 local_688;
  undefined8 uStack_680;
  timespec ts;
  
  attr_len = 0;
  cm = conn->cm;
  if (conn->closed == 0) {
    if (conn->failed != 0) {
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMDataVerbose);
        if (iVar1 != 0) goto LAB_0011f875;
      }
      else if (CMtrace_val[4] != 0) {
LAB_0011f875:
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        pcVar7 = "Not writing data to failed connection\n";
        goto LAB_0011f8fb;
      }
      goto LAB_0011f906;
    }
    if (conn->write_pending != 0) {
      wait_for_pending_write(conn);
    }
    if (format->registration_pending != 0) {
      CMcomplete_format_registration(format,1);
    }
    if (format->fmformat == (FMFormat)0x0) {
      printf("Format registration has failed for format \"%s\" - write aborted\n",
             format->format_name);
      return 0;
    }
    CMformat_preload(conn,format);
    local_6d8 = attrs;
    iVar1 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    if (iVar1 != 0) {
      if (internal_write_event_size_set == '\0') {
        pcVar7 = getenv("CMDumpSize");
        internal_write_event_size_set = '\x01';
        if (pcVar7 != (char *)0x0) {
          internal_write_event::dump_char_limit = atoi(pcVar7);
        }
      }
      pFVar6 = (FILE *)cm->CMTrace_file;
      uVar4 = name_of_FMformat(format->fmformat);
      fprintf(pFVar6,"CM - Writing EVENT record %p of type %s\n",event,uVar4);
      p_Var10 = local_6d8;
      if (local_6d8 == (attr_list)0x0) {
        fwrite("CM - write attrs NULL\n",0x16,1,(FILE *)cm->CMTrace_file);
      }
      else {
        fwrite("CM - write attributes are:",0x1a,1,(FILE *)cm->CMTrace_file);
        fdump_attr_list(cm->CMTrace_file,p_Var10);
      }
      pFVar6 = (FILE *)cm->CMTrace_file;
      uVar4 = name_of_FMformat(format->fmformat);
      fprintf(pFVar6,"CM - record type %s, contents ",uVar4);
      if (event->decoded_event == (void *)0x0) {
        fwrite("ENCODED are:\n  ",0xf,1,(FILE *)cm->CMTrace_file);
        iVar1 = FMfdump_encoded_data
                          (cm->CMTrace_file,format->fmformat,event->encoded_event,
                           internal_write_event::dump_char_limit);
      }
      else {
        fwrite("DECODED are:\n  ",0xf,1,(FILE *)cm->CMTrace_file);
        iVar1 = FMfdump_data(cm->CMTrace_file,format->fmformat,event->decoded_event,
                             internal_write_event::dump_char_limit);
      }
      if (iVar1 == 0 && internal_write_event::warned == 0) {
        fwrite("\n\n  ****  Warning **** CM record dump truncated\n",0x30,1,(FILE *)cm->CMTrace_file
              );
        fwrite("  To change size limits, set CMDumpSize environment variable.\n",0x3e,1,
               (FILE *)cm->CMTrace_file);
        internal_write_event::warned = internal_write_event::warned + 1;
      }
      fwrite("\n=======\n",9,1,(FILE *)cm->CMTrace_file);
      attrs = local_6d8;
    }
    if (event->encoded_event == (void *)0x0) {
      local_6d0 = (FFSEncodeVec *)
                  FFSencode_vector(conn->io_out_buffer,format->fmformat,event->decoded_event);
      sVar12 = 0;
      uVar9 = 0;
      for (psVar5 = &local_6d0->iov_len; ((FFSEncodeVec *)(psVar5 + -1))->iov_base != (void *)0x0;
          psVar5 = psVar5 + 2) {
        sVar12 = sVar12 + *psVar5;
        uVar9 = uVar9 + 1;
      }
    }
    else {
      uVar9 = 1;
      local_6d0 = &local_698;
      sVar12 = event->event_len;
      local_688 = 0;
      uStack_680 = 0;
      local_698.iov_base = event->encoded_event;
      local_698.iov_len = sVar12;
    }
    if (attrs == (attr_list)0x0) {
      local_6b0 = (void *)0x0;
    }
    else {
      local_6b0 = (void *)encode_attr_for_xmit(attrs,conn->attr_encode_buffer,&attr_len);
      attr_len = attr_len + 7U & 0xfffffff8;
    }
    iVar1 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    p_Var10 = local_6d8;
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        p_Var10 = local_6d8;
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "CM - Total write size is %zd bytes data + %d bytes attrs\n",sVar12,
              (ulong)(uint)attr_len);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    if ((cm_write_hook == (_func_int_size_t *)0x0) || (iVar1 = (*cm_write_hook)(sVar12), iVar1 != 0)
       ) {
      header[0] = 0x434d4c00;
      header[1] = 0;
      header[2] = 0;
      header[3] = 0;
      if (uVar9 < 100) {
        full_vec = (FFSEncodeVector)&ts;
      }
      else {
        full_vec = (FFSEncodeVector)INT_CMmalloc(uVar9 * 0x10 + 0x30);
      }
      data_vec = local_6d0;
      header[1] = (int)sVar12;
      if (path_len == 4) {
        header[0] = 0x434d4c00;
        header[3] = *remote_path_id;
        pFVar8 = full_vec;
        sVar11 = sVar12;
        if (p_Var10 == (attr_list)0x0) goto LAB_0011fe02;
LAB_0011fce2:
        full_vec->iov_base = header;
        full_vec->iov_len = 0x10;
        full_vec[1].iov_base = local_6b0;
        sVar11 = (size_t)attr_len;
        header[2] = attr_len;
        full_vec[1].iov_len = sVar11;
        memcpy(full_vec + 2,local_6d0,uVar9 << 4);
        sVar11 = sVar11 + sVar12 + 0x10;
        vec_count = uVar9 + 2;
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            data_vec = local_6d0;
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_3);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_3.tv_sec,ts_3.tv_nsec);
          }
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          pcVar7 = "Writing %lu vectors, total %zu bytes (including attrs) in writev\n";
          goto LAB_0011feec;
        }
      }
      else {
        header[3] = path_len + 7U & 0xfffffff8;
        header[0] = 0x434d4700;
        if (p_Var10 != (attr_list)0x0) goto LAB_0011fce2;
        full_vec[1].iov_base = remote_path_id;
        full_vec[1].iov_len = (long)header[3];
        pFVar8 = full_vec + 1;
        sVar11 = (long)header[3] + sVar12;
LAB_0011fe02:
        header._8_8_ = (ulong)(uint)header[3] << 0x20;
        full_vec->iov_base = header;
        full_vec->iov_len = 0x10;
        memcpy(pFVar8 + 1,local_6d0,uVar9 << 4);
        vec_count = uVar9 + 1;
        sVar11 = sVar11 + 0x10;
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            data_vec = local_6d0;
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_3);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_3.tv_sec,ts_3.tv_nsec);
          }
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          pcVar7 = "Writing %lu vectors, total %zu bytes in writev\n";
LAB_0011feec:
          fprintf(pFVar6,pcVar7,vec_count,sVar11);
        }
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      iVar1 = INT_CMwrite_raw(conn,full_vec,data_vec,vec_count,sVar11,local_6d8,
                              (uint)(data_vec == &local_698));
      if (full_vec != (FFSEncodeVector)&ts) {
        INT_CMfree(full_vec);
      }
      if (iVar1 == 0) {
        iVar1 = CMtrace_val[7];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMFreeVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_3);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_3.tv_sec,ts_3.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Calling connection (write failed) failed with dereference %p\n",conn);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        INT_CMConnection_failed(conn);
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_3);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_3.tv_sec,ts_3.tv_nsec);
          }
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          pcVar7 = "Writev failed\n";
          sStackY_6f0 = 0xe;
          goto LAB_0011f8fd;
        }
        goto LAB_0011f906;
      }
    }
    if (event_len_p != (size_t *)0x0) {
      *event_len_p = sVar12;
    }
    iVar1 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("Writev success\n",0xf,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    iVar1 = 1;
  }
  else {
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(cm,CMDataVerbose);
      if (iVar1 != 0) goto LAB_0011f760;
    }
    else if (CMtrace_val[4] != 0) {
LAB_0011f760:
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar6 = (FILE *)conn->cm->CMTrace_file;
      pcVar7 = "Not writing data to closed connection\n";
LAB_0011f8fb:
      sStackY_6f0 = 0x26;
LAB_0011f8fd:
      fwrite(pcVar7,sStackY_6f0,1,pFVar6);
    }
LAB_0011f906:
    fflush((FILE *)conn->cm->CMTrace_file);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

extern int
 internal_write_event(CMConnection conn, CMFormat format, void *remote_path_id,
		      int path_len, event_item *event, attr_list attrs, size_t *event_len_p)
 {
     FFSEncodeVector vec;
     struct FFSEncodeVec preencoded_vec[2];
     size_t data_length = 0, actual;
     long vec_count = 0;
     int attr_len = 0;
     int do_write = 1;
     void *encoded_attrs = NULL;
     int attrs_present = 0;
     CManager cm = conn->cm;

     /* ensure conn is open */
     if (conn->closed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to closed connection\n");
	 return 0;
     }
     if (conn->failed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to failed connection\n");
	 return 0;
     }
     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     if (format->registration_pending) {
	 CMcomplete_format_registration(format, 1);
     }
     if (format->fmformat == NULL) {
	 printf("Format registration has failed for format \"%s\" - write aborted\n",
		format->format_name);
	 return 0;
     }
     CMformat_preload(conn, format);

     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - Writing EVENT record %p of type %s\n", event,
		name_of_FMformat(format->fmformat));
	 if (attrs != NULL) {
	     fprintf(cm->CMTrace_file, "CM - write attributes are:");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 } else {
	     fprintf(cm->CMTrace_file, "CM - write attrs NULL\n");
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents ", name_of_FMformat(format->fmformat));
	 if (event->decoded_event) {
	     fprintf(cm->CMTrace_file, "DECODED are:\n  ");
	     r = FMfdump_data(cm->CMTrace_file, format->fmformat, event->decoded_event,
			      dump_char_limit);
	 } else {
	     fprintf(cm->CMTrace_file, "ENCODED are:\n  ");
	     r = FMfdump_encoded_data(cm->CMTrace_file, format->fmformat,
				      event->encoded_event, dump_char_limit);
	 }	    
	 if (!r && !warned) {
	     fprintf(cm->CMTrace_file, "\n\n  ****  Warning **** CM record dump truncated\n");
	     fprintf(cm->CMTrace_file, "  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }

     if (!event->encoded_event) {
	 /* encode data with CM context */
	 vec = FFSencode_vector(conn->io_out_buffer,
				format->fmformat, event->decoded_event);
	 while(vec[vec_count].iov_base != NULL) {
	     data_length += vec[vec_count].iov_len;
	     vec_count++;
	 }
     } else {
	 vec = &preencoded_vec[0];
	 preencoded_vec[0].iov_base = event->encoded_event;
	 preencoded_vec[0].iov_len = event->event_len;
	 preencoded_vec[1].iov_base = NULL;
	 preencoded_vec[1].iov_len = 0;
	 vec_count = 1;
	 data_length = event->event_len;
     }
     if (attrs != NULL) {
	 attrs_present++;
	 encoded_attrs = encode_attr_for_xmit(attrs, conn->attr_encode_buffer,
					      &attr_len);
	 attr_len = (attr_len +7) & -8;  /* round up to even 8 */
     }
     CMtrace_out(conn->cm, CMDataVerbose, "CM - Total write size is %zd bytes data + %d bytes attrs\n", data_length, attr_len);
     if (cm_write_hook != NULL) {
	 do_write = cm_write_hook(data_length);
     }
     if (do_write) {
	 struct FFSEncodeVec static_vec[100];
	 FFSEncodeVector tmp_vec = &static_vec[0];
	 size_t byte_count = data_length;/* sum lengths */
	 int header[4] = {0x434d4C00, 0, 0, 0};  /* CML\0 in first entry */
	 if (vec_count >= sizeof(static_vec)/ sizeof(static_vec[0])) {
	     tmp_vec = INT_CMmalloc((vec_count+3) * sizeof(*tmp_vec));
	 }
	 header[1] = (int)data_length;
	 if (path_len != 4) {
	     header[0] = 0x434d4700;
	     header[3] = (path_len + 7) & -8;
	 } else {
	     header[0] = 0x434d4C00;  /* 4 byte chan ID */
	     header[3] = *((int*)remote_path_id);
	 }
	 if (attrs == NULL) {
	     FFSEncodeVector assign_vec = tmp_vec;
	     header[2] = 0;
	     if (path_len != 4) {
		 tmp_vec[1].iov_base = remote_path_id;
		 tmp_vec[1].iov_len = (path_len + 7) & -8;
		 byte_count += tmp_vec[1].iov_len;
		 assign_vec++;
	     }
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     memcpy(&assign_vec[1], vec, sizeof(*tmp_vec) * vec_count);
	     vec_count++;
	     byte_count += sizeof(header);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes in writev\n", 
			 vec_count, byte_count);
	 } else {
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     tmp_vec[1].iov_base = encoded_attrs;
	     header[2] = attr_len;
	     tmp_vec[1].iov_len = attr_len;
	     memcpy(&tmp_vec[2], vec, sizeof(*tmp_vec) * vec_count);
	     byte_count += sizeof(header) + header[2];
	     vec_count += 2;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes (including attrs) in writev\n", 
			 vec_count, byte_count);
	 }
	 actual = INT_CMwrite_raw(conn, tmp_vec, vec, vec_count, byte_count, attrs,
				     vec == &preencoded_vec[0]);
	 if (tmp_vec != &static_vec[0]) {
	     INT_CMfree(tmp_vec);
	 }
	 if (actual <= 0) {
	     /* fail */
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection (write failed) failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writev failed\n");
	     return 0;
	 }
     }
     if (event_len_p) *event_len_p = data_length;
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Writev success\n");
     return 1;
 }